

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderRemoveNode(ImGuiID node_id)

{
  ImGuiDockContext *this;
  ImGuiDockNode *pIVar1;
  ImGuiContext_conflict1 *ctx;
  void *pvVar2;
  ImGuiDockNode *node;
  _Bool clear_settings_refs;
  uint uVar3;
  
  ctx = GImGui;
  this = &GImGui->DockContext;
  pvVar2 = ImGuiStorage::GetVoidPtr(&this->Nodes,node_id);
  if (pvVar2 != (void *)0x0) {
    DockBuilderRemoveNodeDockedWindows((ImGui *)(ulong)node_id,1,clear_settings_refs);
    DockBuilderRemoveNodeChildNodes(node_id);
    node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&this->Nodes,node_id);
    if (node != (ImGuiDockNode *)0x0) {
      if (((node->MergedFlags & 0x800) != 0) &&
         (pIVar1 = node->ParentNode, pIVar1 != (ImGuiDockNode *)0x0)) {
        uVar3 = pIVar1->LocalFlags | 0x800;
        pIVar1->LocalFlags = uVar3;
        pIVar1->MergedFlags = pIVar1->SharedFlags | pIVar1->LocalFlagsInWindows | uVar3;
      }
      DockContextRemoveNode(ctx,node,true);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNode(ImGuiID node_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    DockBuilderRemoveNodeDockedWindows(node_id, true);
    DockBuilderRemoveNodeChildNodes(node_id);
    // Node may have moved or deleted if e.g. any merge happened
    node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    if (node->IsCentralNode() && node->ParentNode)
        node->ParentNode->SetLocalFlags(node->ParentNode->LocalFlags | ImGuiDockNodeFlags_CentralNode);
    DockContextRemoveNode(ctx, node, true);
}